

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternmodifier.cpp
# Opt level: O0

ImmutablePatternModifier * __thiscall
icu_63::number::impl::MutablePatternModifier::createImmutableAndChain
          (MutablePatternModifier *this,MicroPropsGenerator *parent,UErrorCode *status)

{
  Form plural_00;
  bool bVar1;
  UBool UVar2;
  AdoptingModifierStore *this_00;
  ConstantMultiFieldModifier *pCVar3;
  MutablePatternModifier *pMVar4;
  MicroPropsGenerator *size;
  size_t size_00;
  MutablePatternModifier *local_110;
  MutablePatternModifier *local_e0;
  AdoptingModifierStore *local_90;
  Form plural;
  Form *__end2;
  Form *__begin2;
  Form (*__range2) [6];
  AdoptingModifierStore *pm;
  UErrorCode *status_local;
  MicroPropsGenerator *parent_local;
  MutablePatternModifier *this_local;
  
  size = parent;
  this_00 = (AdoptingModifierStore *)UMemory::operator_new((UMemory *)0x98,(size_t)parent);
  local_90 = (AdoptingModifierStore *)0x0;
  if (this_00 != (AdoptingModifierStore *)0x0) {
    size = (MicroPropsGenerator *)0x0;
    memset(this_00,0,0x98);
    AdoptingModifierStore::AdoptingModifierStore(this_00);
    local_90 = this_00;
  }
  if (local_90 == (AdoptingModifierStore *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    this_local = (MutablePatternModifier *)0x0;
  }
  else {
    bVar1 = needsPlurals(this);
    if (bVar1) {
      for (__end2 = createImmutableAndChain::STANDARD_PLURAL_VALUES;
          __end2 != (Form *)"N6icu_636number4impl20AffixPatternProviderE"; __end2 = __end2 + 1) {
        plural_00 = *__end2;
        setNumberProperties(this,'\x01',plural_00);
        pCVar3 = createConstantModifier(this,status);
        AdoptingModifierStore::adoptModifier(local_90,'\x01',plural_00,&pCVar3->super_Modifier);
        setNumberProperties(this,'\0',plural_00);
        pCVar3 = createConstantModifier(this,status);
        AdoptingModifierStore::adoptModifier(local_90,'\0',plural_00,&pCVar3->super_Modifier);
        setNumberProperties(this,-1,plural_00);
        pCVar3 = createConstantModifier(this,status);
        size = (MicroPropsGenerator *)0xffffffff;
        AdoptingModifierStore::adoptModifier(local_90,-1,plural_00,&pCVar3->super_Modifier);
      }
      UVar2 = ::U_FAILURE(*status);
      if (UVar2 == '\0') {
        pMVar4 = (MutablePatternModifier *)UMemory::operator_new((UMemory *)0x20,(size_t)size);
        local_e0 = (MutablePatternModifier *)0x0;
        if (pMVar4 != (MutablePatternModifier *)0x0) {
          ImmutablePatternModifier::ImmutablePatternModifier
                    ((ImmutablePatternModifier *)pMVar4,local_90,this->fRules,parent);
          local_e0 = pMVar4;
        }
        this_local = local_e0;
      }
      else {
        if (local_90 != (AdoptingModifierStore *)0x0) {
          (*(local_90->super_ModifierStore)._vptr_ModifierStore[1])();
        }
        this_local = (MutablePatternModifier *)0x0;
      }
    }
    else {
      setNumberProperties(this,'\x01',COUNT);
      pCVar3 = createConstantModifier(this,status);
      AdoptingModifierStore::adoptModifierWithoutPlural(local_90,'\x01',&pCVar3->super_Modifier);
      setNumberProperties(this,'\0',COUNT);
      pCVar3 = createConstantModifier(this,status);
      AdoptingModifierStore::adoptModifierWithoutPlural(local_90,'\0',&pCVar3->super_Modifier);
      setNumberProperties(this,-1,COUNT);
      pCVar3 = createConstantModifier(this,status);
      size_00 = 0xffffffff;
      AdoptingModifierStore::adoptModifierWithoutPlural(local_90,-1,&pCVar3->super_Modifier);
      UVar2 = ::U_FAILURE(*status);
      if (UVar2 == '\0') {
        pMVar4 = (MutablePatternModifier *)UMemory::operator_new((UMemory *)0x20,size_00);
        local_110 = (MutablePatternModifier *)0x0;
        if (pMVar4 != (MutablePatternModifier *)0x0) {
          ImmutablePatternModifier::ImmutablePatternModifier
                    ((ImmutablePatternModifier *)pMVar4,local_90,(PluralRules *)0x0,parent);
          local_110 = pMVar4;
        }
        this_local = local_110;
      }
      else {
        if (local_90 != (AdoptingModifierStore *)0x0) {
          (*(local_90->super_ModifierStore)._vptr_ModifierStore[1])();
        }
        this_local = (MutablePatternModifier *)0x0;
      }
    }
  }
  return (ImmutablePatternModifier *)this_local;
}

Assistant:

ImmutablePatternModifier*
MutablePatternModifier::createImmutableAndChain(const MicroPropsGenerator* parent, UErrorCode& status) {

    // TODO: Move StandardPlural VALUES to standardplural.h
    static const StandardPlural::Form STANDARD_PLURAL_VALUES[] = {
            StandardPlural::Form::ZERO,
            StandardPlural::Form::ONE,
            StandardPlural::Form::TWO,
            StandardPlural::Form::FEW,
            StandardPlural::Form::MANY,
            StandardPlural::Form::OTHER};

    auto pm = new AdoptingModifierStore();
    if (pm == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return nullptr;
    }

    if (needsPlurals()) {
        // Slower path when we require the plural keyword.
        for (StandardPlural::Form plural : STANDARD_PLURAL_VALUES) {
            setNumberProperties(1, plural);
            pm->adoptModifier(1, plural, createConstantModifier(status));
            setNumberProperties(0, plural);
            pm->adoptModifier(0, plural, createConstantModifier(status));
            setNumberProperties(-1, plural);
            pm->adoptModifier(-1, plural, createConstantModifier(status));
        }
        if (U_FAILURE(status)) {
            delete pm;
            return nullptr;
        }
        return new ImmutablePatternModifier(pm, fRules, parent);  // adopts pm
    } else {
        // Faster path when plural keyword is not needed.
        setNumberProperties(1, StandardPlural::Form::COUNT);
        pm->adoptModifierWithoutPlural(1, createConstantModifier(status));
        setNumberProperties(0, StandardPlural::Form::COUNT);
        pm->adoptModifierWithoutPlural(0, createConstantModifier(status));
        setNumberProperties(-1, StandardPlural::Form::COUNT);
        pm->adoptModifierWithoutPlural(-1, createConstantModifier(status));
        if (U_FAILURE(status)) {
            delete pm;
            return nullptr;
        }
        return new ImmutablePatternModifier(pm, nullptr, parent);  // adopts pm
    }
}